

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image * rf_get_frame_from_gif(rf_image *__return_storage_ptr__,rf_gif gif,int frame)

{
  rf_gif gif_00;
  int iVar1;
  rf_sizei rVar2;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uStack_1c;
  int local_14;
  int iStack_10;
  rf_sizei size;
  int frame_local;
  
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [40])gif & (undefined1  [40])0x100000000) != (undefined1  [40])0x0) {
    gif_00.field_2._16_8_ = in_stack_ffffffffffffffa0;
    gif_00._0_32_ = gif._8_32_;
    rVar2 = rf_gif_frame_size(gif_00);
    local_14 = rVar2.width;
    iStack_10 = rVar2.height;
    iVar1 = rf_bytes_per_pixel(gif.field_2.image.format);
    __return_storage_ptr__->data =
         (void *)((long)gif.field_2.image.data + (long)(local_14 * iStack_10 * iVar1 * frame));
    __return_storage_ptr__->width = rVar2.width;
    __return_storage_ptr__->height = rVar2.height;
    __return_storage_ptr__->format = gif.field_2._16_4_;
    __return_storage_ptr__->valid = true;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_1c._1_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_get_frame_from_gif(rf_gif gif, int frame)
{
    rf_image result = {0};

    if (gif.valid)
    {
        rf_sizei size = rf_gif_frame_size(gif);

        result = (rf_image)
        {
            .data   = ((unsigned char*)gif.data) + (size.width * size.height * rf_bytes_per_pixel(gif.format)) * frame,
            .width  = size.width,
            .height = size.height,
            .format = gif.format,
            .valid  = true,
        };
    }

    return result;
}